

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O2

bool QMakeInternal::IoUtils::touchFile
               (QString *targetFileName,QString *referenceFileName,QString *errorString)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  int iVar4;
  storage_type *psVar5;
  int *piVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  char *local_160;
  QByteArrayView local_158;
  QArrayDataPointer<char16_t> local_148;
  QByteArrayView local_130;
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  __syscall_slong_t _Stack_d0;
  stat st;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&st,0xaa,0x90);
  QString::toLocal8Bit((QByteArray *)&local_e8,referenceFileName);
  pcVar7 = local_e8.ptr;
  if (local_e8.ptr == (char16_t *)0x0) {
    pcVar7 = (char16_t *)&QByteArray::_empty;
  }
  iVar4 = stat((char *)pcVar7,(stat *)&st);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_e8);
  if (iVar4 == 0) {
    local_e8.d = (Data *)0x0;
    local_e8.ptr = (char16_t *)0x3fffffff;
    local_e8.size = st.st_mtim.tv_sec;
    _Stack_d0 = st.st_mtim.tv_nsec;
    QString::toLocal8Bit((QByteArray *)&local_108,targetFileName);
    pcVar7 = local_108.ptr;
    if (local_108.ptr == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QByteArray::_empty;
    }
    iVar4 = utimensat(-100,(char *)pcVar7,(timespec *)&local_e8,0);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_108);
    bVar8 = -1 < iVar4;
    if (!bVar8) {
      psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("Cannot touch %1: %2.",0x15);
      QVar11.m_data = psVar5;
      QVar11.m_size = (qsizetype)&local_120;
      QString::fromLatin1(QVar11);
      piVar6 = __errno_location();
      local_160 = strerror(*piVar6);
      QByteArrayView::QByteArrayView<char_*,_true>(&local_158,&local_160);
      QVar12.m_data = (storage_type *)local_158.m_size;
      QVar12.m_size = (qsizetype)&local_148;
      QString::fromLatin1(QVar12);
      QString::arg<QString_const&,QString>
                ((type *)&local_108,(QString *)&local_120,targetFileName,(QString *)&local_148);
      pDVar3 = (errorString->d).d;
      pcVar7 = (errorString->d).ptr;
      (errorString->d).d = local_108.d;
      (errorString->d).ptr = local_108.ptr;
      qVar2 = (errorString->d).size;
      (errorString->d).size = local_108.size;
      local_108.d = pDVar3;
      local_108.ptr = pcVar7;
      local_108.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
    }
  }
  else {
    psVar5 = (storage_type *)
             QByteArrayView::lengthHelperCharArray("Cannot stat() reference file %1: %2.",0x25);
    QVar9.m_data = psVar5;
    QVar9.m_size = (qsizetype)&local_108;
    QString::fromLatin1(QVar9);
    piVar6 = __errno_location();
    local_148.d = (Data *)strerror(*piVar6);
    QByteArrayView::QByteArrayView<char_*,_true>(&local_130,(char **)&local_148);
    QVar10.m_data = (storage_type *)local_130.m_size;
    QVar10.m_size = (qsizetype)&local_120;
    QString::fromLatin1(QVar10);
    QString::arg<QString_const&,QString>
              ((type *)&local_e8,(QString *)&local_108,referenceFileName,(QString *)&local_120);
    pDVar3 = (errorString->d).d;
    pcVar7 = (errorString->d).ptr;
    (errorString->d).d = local_e8.d;
    (errorString->d).ptr = local_e8.ptr;
    qVar2 = (errorString->d).size;
    (errorString->d).size = local_e8.size;
    local_e8.d = pDVar3;
    local_e8.ptr = pcVar7;
    local_e8.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    bVar8 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool IoUtils::touchFile(const QString &targetFileName, const QString &referenceFileName, QString *errorString)
{
#  ifdef Q_OS_UNIX
    struct stat st;
    if (stat(referenceFileName.toLocal8Bit().constData(), &st)) {
        *errorString = fL1S("Cannot stat() reference file %1: %2.").arg(referenceFileName, fL1S(strerror(errno)));
        return false;
    }
#    if (defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L) || defined(Q_OS_DARWIN)
    const struct timespec times[2] = { { 0, UTIME_NOW },
#      if defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L
        st.st_mtim // POSIX.1-2008
#      else
        st.st_mtimespec // Darwin
#      endif
    };
    const bool utimeError = utimensat(AT_FDCWD, targetFileName.toLocal8Bit().constData(), times, 0) < 0;
#    else
    struct utimbuf utb;
    utb.actime = time(0);
    utb.modtime = st.st_mtime;
    const bool utimeError= utime(targetFileName.toLocal8Bit().constData(), &utb) < 0;
#    endif // (defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L) || defined(Q_OS_DARWIN)
    if (utimeError) {
        *errorString = fL1S("Cannot touch %1: %2.").arg(targetFileName, fL1S(strerror(errno)));
        return false;
    }
#  else
    HANDLE rHand = CreateFile((wchar_t*)referenceFileName.utf16(),
                              GENERIC_READ, FILE_SHARE_READ,
                              NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (rHand == INVALID_HANDLE_VALUE) {
        *errorString = fL1S("Cannot open reference file %1: %2")
            .arg(referenceFileName, QSystemError::windowsString());
        return false;
        }
    FILETIME ft;
    GetFileTime(rHand, NULL, NULL, &ft);
    CloseHandle(rHand);
    HANDLE wHand = CreateFile((wchar_t*)targetFileName.utf16(),
                              GENERIC_WRITE, FILE_SHARE_READ,
                              NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (wHand == INVALID_HANDLE_VALUE) {
        *errorString = fL1S("Cannot open %1: %2")
            .arg(targetFileName, QSystemError::windowsString());
        return false;
    }
    SetFileTime(wHand, NULL, NULL, &ft);
    CloseHandle(wHand);
#  endif // Q_OS_UNIX
    return true;
}